

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
slang::splitString(vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *__return_storage_ptr__,slang *this,string_view str,char delimiter)

{
  pointer *ppbVar1;
  slang *__s;
  iterator iVar2;
  void *pvVar3;
  size_t sVar4;
  long lVar5;
  slang *psVar6;
  ulong __n;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  int local_34;
  
  sVar4 = str._M_len;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this == (slang *)0x0) {
    psVar6 = (slang *)0x0;
  }
  else {
    local_34 = (int)(char)str._M_str;
    psVar6 = (slang *)0x0;
    do {
      __n = (long)this - (long)psVar6;
      __s = psVar6 + sVar4;
      pvVar3 = memchr(__s,local_34,__n);
      if ((pvVar3 == (void *)0x0) || (lVar5 = (long)pvVar3 - sVar4, lVar5 == -1)) break;
      local_48._M_len = lVar5 - (long)psVar6;
      if (__n < (ulong)(lVar5 - (long)psVar6)) {
        local_48._M_len = __n;
      }
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_48._M_str = (char *)__s;
      if (iVar2._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)__return_storage_ptr__,iVar2,&local_48);
      }
      else {
        (iVar2._M_current)->_M_len = local_48._M_len;
        (iVar2._M_current)->_M_str = (char *)__s;
        ppbVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      psVar6 = (slang *)(lVar5 + 1);
    } while (psVar6 < this);
    if (this < psVar6) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 psVar6,this);
    }
  }
  local_48._M_len = (long)this - (long)psVar6;
  local_48._M_str = (char *)(psVar6 + sVar4);
  iVar2._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)__return_storage_ptr__,iVar2,&local_48);
  }
  else {
    (iVar2._M_current)->_M_len = local_48._M_len;
    (iVar2._M_current)->_M_str = local_48._M_str;
    ppbVar1 = &(__return_storage_ptr__->
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppbVar1 = *ppbVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string_view> splitString(std::string_view str, char delimiter) {
    std::vector<std::string_view> result;
    std::string_view::size_type index = 0;
    while (true) {
        auto nextIndex = str.find(delimiter, index);
        if (nextIndex == std::string_view::npos) {
            result.push_back(str.substr(index));
            break;
        }

        result.push_back(str.substr(index, nextIndex - index));
        index = nextIndex + 1;
    }
    return result;
}